

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.h
# Opt level: O2

char * absl::LogSeverityName(LogSeverity s)

{
  char *pcVar1;
  
  if (s < kFatal) {
    return &DAT_0026d308 + *(int *)(&DAT_0026d308 + (ulong)s * 4);
  }
  pcVar1 = "UNKNOWN";
  if (s == kFatal) {
    pcVar1 = "FATAL";
  }
  return pcVar1;
}

Assistant:

constexpr const char* LogSeverityName(absl::LogSeverity s) {
  return s == absl::LogSeverity::kInfo
             ? "INFO"
             : s == absl::LogSeverity::kWarning
                   ? "WARNING"
                   : s == absl::LogSeverity::kError
                         ? "ERROR"
                         : s == absl::LogSeverity::kFatal ? "FATAL" : "UNKNOWN";
}